

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.c
# Opt level: O2

void sample_unit_disc(Sampler *sampler,float *x,float *y,float *pdf)

{
  float fVar1;
  float v;
  float u;
  float local_30;
  float local_2c;
  
  sample_unit_square(sampler,&local_2c,&local_30,(float *)0x0);
  if (local_30 < 0.0) {
    local_30 = sqrtf(local_30);
  }
  else {
    local_30 = SQRT(local_30);
  }
  fVar1 = cosf(local_2c * 6.2831855);
  *x = fVar1 * local_30;
  fVar1 = sinf(local_2c * 6.2831855);
  *y = fVar1 * local_30;
  if (pdf != (float *)0x0) {
    *pdf = 0.31830987;
  }
  return;
}

Assistant:

void sample_unit_disc(Sampler* sampler, float* x, float* y, float* pdf) {
    float u, v;
    sample_unit_square(sampler, &u, &v, NULL);
    float theta = 2 * PI * u;
    float r = sqrtf(v);

    *x = r * cosf(theta);
    *y = r * sinf(theta);
    if (pdf)
        *pdf = 1.0f / PI;
}